

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O0

void mnf::ExpMapMatrix::forceOnM_(RefVec *out,ConstRefVec *in)

{
  Scalar SVar1;
  RealScalar RVar2;
  ReturnType RVar3;
  bool bVar4;
  bool bVar5;
  Scalar *dataPtr;
  ScalarWithConstIfNotLvalue *dataPtr_00;
  Scalar *pSVar6;
  ColXpr local_940;
  ColXpr local_908;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_8d8;
  ColXpr local_890;
  ColXpr local_860;
  ColXpr local_830;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_7f8;
  ColXpr local_7a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_778;
  ColXpr local_6f0;
  ColXpr local_6c0;
  ColXpr local_688;
  ColXpr local_650;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_620;
  ColXpr local_5d8;
  ColXpr local_5a8;
  ColXpr local_578;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_540;
  ColXpr local_4f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_4c0;
  ColXpr local_438;
  ColXpr local_408;
  ColXpr local_3d0;
  ColXpr local_3a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_368;
  ColXpr local_318;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_2e8;
  ColXpr local_260;
  ColXpr local_230;
  ColXpr local_1f8;
  ColXpr local_1c0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_190;
  ColXpr local_148;
  undefined1 local_118 [8];
  Matrix3d R;
  undefined1 local_c8 [8];
  toMat3 Q;
  Matrix3d A;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_63 [3];
  TransposeReturnType local_60;
  Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_50;
  Stride<0,_0> local_2a;
  undefined1 local_28 [8];
  toConstMat3 inMat;
  ConstRefVec *in_local;
  RefVec *out_local;
  
  inMat.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _8_8_ = in;
  dataPtr = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::data((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                    *)in);
  Eigen::Stride<0,_0>::Stride(&local_2a);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_28,
             dataPtr,&local_2a);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(&local_60,
              (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
               *)local_28);
  Eigen::
  MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>>
  ::operator*(&local_50,
              (MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>>
               *)&local_60,
              (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
               *)local_28);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  A.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.1;
  bVar5 = Eigen::
          DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>,0>>
          ::
          isApprox<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
                    ((DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>,0>>
                      *)&local_50,local_63,
                     A.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                     .array + 8);
  bVar4 = false;
  if (bVar5) {
    SVar1 = Eigen::
            MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
            ::determinant((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                           *)local_28);
    bVar4 = false;
    if (ABS(SVar1 - 1.0) < 0.1) {
      bVar4 = true;
    }
  }
  if (bVar4) {
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>
              ((Matrix<double,3,3,0,3,3> *)&Q.field_0x8,
               (Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_28)
    ;
    dataPtr_00 = Eigen::
                 MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                 ::data((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)out);
    Eigen::Stride<0,_0>::Stride
              ((Stride<0,_0> *)
               ((long)R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array + 0x46));
    Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
              ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_c8,
               dataPtr_00,
               (Stride<0,_0> *)
               ((long)R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array + 0x46));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_118);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_148,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,0);
    RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                        *)&local_148);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,0,0);
    *pSVar6 = RVar2;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_1c0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,0);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,0,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
              (&local_190,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_1c0,
               pSVar6);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_1f8,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,0);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>::
    operator=((Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true> *)
              &local_1f8,
              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)&local_190);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_230,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_260,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,1);
    RVar3 = Eigen::
            MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
            ::dot<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
                        *)&local_230,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                        *)&local_260);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,0,1);
    *pSVar6 = RVar3;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_318,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,1);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_3a0,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,0);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,0,1);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
    ::operator*(&local_368,
                (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
                 *)&local_3a0,pSVar6);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator-
              (&local_2e8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_318,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_368);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_3d0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,1);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true> *)&local_3d0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                *)&local_2e8);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_408,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_438,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    RVar3 = Eigen::
            MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
            ::dot<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
                        *)&local_408,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                        *)&local_438);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,0,2);
    *pSVar6 = RVar3;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_4f0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_578,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,0);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,0,2);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
    ::operator*(&local_540,
                (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
                 *)&local_578,pSVar6);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator-
              (&local_4c0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_4f0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_540);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_5a8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true> *)&local_5a8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                *)&local_4c0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_5d8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,1);
    RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                        *)&local_5d8);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,1,1);
    *pSVar6 = RVar2;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_650,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,1);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,1,1);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
              (&local_620,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_650,
               pSVar6);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_688,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,1);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>::
    operator=((Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true> *)
              &local_688,
              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)&local_620);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_6c0,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_6f0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    RVar3 = Eigen::
            MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
            ::dot<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
                        *)&local_6c0,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                        *)&local_6f0);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,1,2);
    *pSVar6 = RVar3;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_7a8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_830,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,1);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,1,2);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
    ::operator*(&local_7f8,
                (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
                 *)&local_830,pSVar6);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator-
              (&local_778,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_7a8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_7f8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_860,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true> *)&local_860,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                *)&local_778);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_890,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                        *)&local_890);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,2,2);
    *pSVar6 = RVar2;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_908,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&Q.field_0x8,2);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_118,2,2);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
              (&local_8d8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_908,
               pSVar6);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
    col(&local_940,
        (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
        local_c8,2);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>::
    operator=((Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true> *)
              &local_940,
              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)&local_8d8);
    return;
  }
  __assert_fail("(inMat.transpose() * inMat).isApprox(Eigen::Matrix3d::Identity(), 0.1) && fabs(inMat.determinant() - 1.0) < 0.1 && \"Provided matrix is too far from being a rotation matrix. You should use \" \"createRandomPoint instead of forceOnM\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/ExpMapMatrix.cpp"
                ,0x94,"static void mnf::ExpMapMatrix::forceOnM_(RefVec, const ConstRefVec &)");
}

Assistant:

void ExpMapMatrix::forceOnM_(RefVec out, const ConstRefVec& in)
{
  toConstMat3 inMat(in.data());
  mnf_assert(
      (inMat.transpose() * inMat).isApprox(Eigen::Matrix3d::Identity(), 0.1) &&
      fabs(inMat.determinant() - 1.0) < 0.1 &&
      "Provided matrix is too far from being a rotation matrix. You should use "
      "createRandomPoint instead of forceOnM");
  Eigen::Matrix3d A(
      inMat);  // TODO it is bad to copy it here. Maybe in shouldn't be const???
  toMat3 Q(out.data());
  Eigen::Matrix3d R;
  // the following scope contains the code to compute a QR on R3x3
  {
    // k = 0
    R(0, 0) = A.col(0).norm();
    Q.col(0) = A.col(0) / R(0, 0);
    // j = 1
    R(0, 1) = Q.col(0).dot(A.col(1));
    A.col(1) = A.col(1) - Q.col(0) * R(0, 1);
    // j = 2
    R(0, 2) = Q.col(0).dot(A.col(2));
    A.col(2) = A.col(2) - Q.col(0) * R(0, 2);
    // k = 1
    R(1, 1) = A.col(1).norm();
    Q.col(1) = A.col(1) / R(1, 1);
    // j = 2
    R(1, 2) = Q.col(1).dot(A.col(2));
    A.col(2) = A.col(2) - Q.col(1) * R(1, 2);
    // k = 2
    R(2, 2) = A.col(2).norm();
    Q.col(2) = A.col(2) / R(2, 2);
  }
}